

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

int __thiscall QtMWidgets::MsgBoxTitlePrivate::init(MsgBoxTitlePrivate *this,EVP_PKEY_CTX *ctx)

{
  MsgBoxTitle *pMVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  QWidget local_38 [24];
  QWidget local_20 [8];
  int local_18;
  int local_14;
  MsgBoxTitlePrivate *local_10;
  MsgBoxTitlePrivate *this_local;
  
  local_10 = this;
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  QWidget::setSizePolicy(&this->q->super_QWidget,Expanding,Fixed);
  pMVar1 = this->q;
  local_14 = FingerGeometry::height();
  QWidget::fontMetrics(local_20);
  iVar2 = QFontMetrics::height();
  QWidget::fontMetrics(local_38);
  iVar3 = QFontMetrics::height();
  local_18 = iVar2 + iVar3 / 3;
  qMax<int>(&local_14,&local_18);
  QWidget::setMinimumHeight((int)pMVar1);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_38);
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_20);
  prepareTitle(this);
  return extraout_EAX;
}

Assistant:

void
MsgBoxTitlePrivate::init()
{
	q->setBackgroundRole( QPalette::Window );
	q->setAutoFillBackground( true );
	q->setSizePolicy( QSizePolicy::Expanding, QSizePolicy::Fixed );
	q->setMinimumHeight( qMax( FingerGeometry::height(),
		q->fontMetrics().height() + q->fontMetrics().height() / 3 ) );

	prepareTitle();
}